

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::loadArguments(Executor *this,int argc,char **argv)

{
  allocator<unsigned_int> *this_00;
  uint uVar1;
  value_type vVar2;
  ulong uVar3;
  reference pvVar4;
  runtime_error *prVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  uint local_98;
  allocator<unsigned_int> local_91;
  uint i_2;
  Values initial;
  uint i_1;
  uint local_58;
  uint i;
  allocator<unsigned_int> local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint local_28;
  uint local_24;
  uint it;
  uint numberOfUnits;
  char **argv_local;
  Executor *pEStack_10;
  int argc_local;
  Executor *this_local;
  
  _it = argv;
  argv_local._4_4_ = argc;
  pEStack_10 = this;
  if ((argc + -1) % 3 == 0) {
    local_24 = (argc + -1) / 3;
    if ((int)local_24 < 1) {
      local_24 = -local_24;
    }
    local_28 = 1;
    uVar3 = (ulong)local_24;
    std::allocator<unsigned_int>::allocator(&local_41);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,uVar3,&local_41);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_sizes,&local_40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
    std::allocator<unsigned_int>::~allocator(&local_41);
    for (local_58 = 0; local_58 < local_24; local_58 = local_58 + 1) {
      vVar2 = atoi(_it[local_28]);
      if ((int)vVar2 < 1) {
        vVar2 = -vVar2;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_sizes,(ulong)local_58);
      *pvVar4 = vVar2;
      local_28 = local_28 + 1;
    }
    uVar3 = (ulong)local_24;
    this_00 = (allocator<unsigned_int> *)
              ((long)&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,uVar3,this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_desired,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    for (initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < local_24;
        initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) {
      vVar2 = atoi(_it[local_28]);
      if ((int)vVar2 < 1) {
        vVar2 = -vVar2;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_desired,
                          (ulong)(uint)initial.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar4 = vVar2;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_desired,
                          (ulong)(uint)initial.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_sizes,
                          (ulong)(uint)initial.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pvVar4 < uVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Desired value is bigger than units size.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_28 = local_28 + 1;
    }
    uVar3 = (ulong)local_24;
    std::allocator<unsigned_int>::allocator(&local_91);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,uVar3,&local_91);
    std::allocator<unsigned_int>::~allocator(&local_91);
    for (local_98 = 0; local_98 < local_24; local_98 = local_98 + 1) {
      vVar2 = atoi(_it[local_28]);
      if ((int)vVar2 < 1) {
        vVar2 = -vVar2;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,
                          (ulong)local_98);
      *pvVar4 = vVar2;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,
                          (ulong)local_98);
      uVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_sizes,(ulong)local_98);
      if (*pvVar4 < uVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Initial value is bigger than units size.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_28 = local_28 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_b0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2);
    execute(this,&local_b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Wrong arguments.");
  }
  return;
}

Assistant:

void Executor::loadArguments(int argc, char *argv[])
{
    if ((argc - 1) % 3 != 0)
    {
        std::cout << "Wrong arguments.";
        return;
    }

    unsigned int numberOfUnits = std::abs((argc - 1 ) / 3);

    unsigned int it = 1;

    m_sizes = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_sizes[i] = std::abs(std::atoi(argv[it]));
        ++it;
    }

    m_desired = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_desired[i] = std::abs(std::atoi(argv[it]));
        if (m_desired[i] > m_sizes[i])
            throw std::runtime_error("Desired value is bigger than units size.");
        ++it;
    }

    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        initial[i] = std::abs(std::atoi(argv[it]));
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
        ++it;
    }

    execute(std::move(initial));
}